

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MS3DImporter::CollectChildJoints
          (MS3DImporter *this,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *joints,aiNode *nd)

{
  aiMatrix4x4 trafo;
  allocator_type local_91;
  vector<bool,_std::allocator<bool>_> local_90;
  aiMatrix4x4 local_68;
  
  local_68.a1 = (float)((uint)local_68.a1 & 0xffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_90,
             ((long)(joints->
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(joints->
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3,
             (bool *)&local_68,&local_91);
  local_68.a1 = 1.0;
  local_68.a2 = 0.0;
  local_68.a3 = 0.0;
  local_68.a4 = 0.0;
  local_68.b1 = 0.0;
  local_68.b2 = 1.0;
  local_68.b3 = 0.0;
  local_68.b4 = 0.0;
  local_68.c1 = 0.0;
  local_68.c2 = 0.0;
  local_68.c3 = 1.0;
  local_68.c4 = 0.0;
  local_68.d1 = 0.0;
  local_68.d2 = 0.0;
  local_68.d3 = 0.0;
  local_68.d4 = 1.0;
  CollectChildJoints(this,joints,&local_90,nd,&local_68);
  if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void MS3DImporter :: CollectChildJoints(const std::vector<TempJoint>& joints, aiNode* nd)
{
     std::vector<bool> hadit(joints.size(),false);
     aiMatrix4x4 trafo;

     CollectChildJoints(joints,hadit,nd,trafo);
}